

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoding.c
# Opt level: O3

exr_result_t exr_decoding_run(exr_const_context_t ctxt,int part_index,exr_decode_pipeline_t *decode)

{
  long lVar1;
  exr_result_t eVar2;
  code *UNRECOVERED_JUMPTABLE;
  char *pcVar3;
  undefined8 uVar4;
  
  if (ctxt == (exr_const_context_t)0x0) {
    return 2;
  }
  if (*ctxt != (_priv_exr_context_t)0x0) {
    UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x38);
    uVar4 = 7;
LAB_001241ff:
    eVar2 = (*UNRECOVERED_JUMPTABLE)(ctxt,uVar4);
    return eVar2;
  }
  if ((part_index < 0) || (*(int *)(ctxt + 0xc4) <= part_index)) {
    eVar2 = (**(code **)(ctxt + 0x48))
                      (ctxt,4,"Part index (%d) out of range",part_index,*(code **)(ctxt + 0x48));
    return eVar2;
  }
  if (decode == (exr_decode_pipeline_t *)0x0) {
    UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x38);
    uVar4 = 3;
    goto LAB_001241ff;
  }
  if ((decode->context == ctxt) && (decode->part_index == part_index)) {
    if (decode->read_fn != (_func_exr_result_t__exr_decode_pipeline_ptr *)0x0) {
      lVar1 = *(long *)(*(long *)(ctxt + 0x1d8) + (ulong)(uint)part_index * 8);
      eVar2 = (*decode->read_fn)(decode);
      if (eVar2 == 0) {
        eVar2 = update_pack_unpack_ptrs(decode);
        if (eVar2 != 0) {
          UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x40);
          pcVar3 = "Decode pipeline unable to update pack / unpack pointers";
          goto LAB_001242e4;
        }
        if ((decode->decompress_fn != (_func_exr_result_t__exr_decode_pipeline_ptr *)0x0) &&
           (eVar2 = (*decode->decompress_fn)(decode), eVar2 != 0)) {
          UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x40);
          pcVar3 = "Decode pipeline unable to decompress data";
          goto LAB_001242e4;
        }
        if ((*(uint *)(lVar1 + 4) & 0xfffffffe) == 2) {
          eVar2 = unpack_sample_table((_internal_exr_context *)ctxt,decode);
          if ((decode->decode_flags & 4) != 0) {
            return eVar2;
          }
          if (eVar2 != 0) {
            UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x40);
            pcVar3 = "Decode pipeline unable to unpack deep sample table";
            goto LAB_001242a3;
          }
        }
        if ((decode->realloc_nonimage_data_fn == (_func_exr_result_t__exr_decode_pipeline_ptr *)0x0)
           || (eVar2 = (*decode->realloc_nonimage_data_fn)(decode), eVar2 == 0)) {
          if ((decode->unpack_and_convert_fn == (_func_exr_result_t__exr_decode_pipeline_ptr *)0x0)
             || (eVar2 = (*decode->unpack_and_convert_fn)(decode), eVar2 == 0)) {
            return 0;
          }
          UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x40);
          pcVar3 = "Decode pipeline unable to unpack and convert data";
        }
        else {
          UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x40);
          pcVar3 = "Decode pipeline unable to realloc deep sample table info";
        }
      }
      else {
        UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x40);
        pcVar3 = "Unable to read pixel data block from context";
      }
LAB_001242e4:
      eVar2 = (*UNRECOVERED_JUMPTABLE)(ctxt,eVar2,pcVar3,UNRECOVERED_JUMPTABLE);
      return eVar2;
    }
    UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x40);
    pcVar3 = "Decode pipeline has no read_fn declared";
  }
  else {
    UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x40);
    pcVar3 = "Invalid request for decoding update from different context / part";
  }
  eVar2 = 3;
LAB_001242a3:
  eVar2 = (*UNRECOVERED_JUMPTABLE)(ctxt,eVar2,pcVar3);
  return eVar2;
}

Assistant:

exr_result_t
exr_decoding_run (
    exr_const_context_t ctxt, int part_index, exr_decode_pipeline_t* decode)
{
    exr_result_t rv;
    EXR_PROMOTE_READ_CONST_CONTEXT_AND_PART_OR_ERROR (ctxt, part_index);

    if (!decode) return pctxt->standard_error (pctxt, EXR_ERR_INVALID_ARGUMENT);
    if (decode->context != ctxt || decode->part_index != part_index)
        return pctxt->report_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid request for decoding update from different context / part");

    if (!decode->read_fn)
        return pctxt->report_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Decode pipeline has no read_fn declared");
    rv = decode->read_fn (decode);
    if (rv != EXR_ERR_SUCCESS)
        return pctxt->report_error (
            pctxt, rv, "Unable to read pixel data block from context");

    if (rv == EXR_ERR_SUCCESS) rv = update_pack_unpack_ptrs (decode);
    if (rv != EXR_ERR_SUCCESS)
        return pctxt->report_error (
            pctxt,
            rv,
            "Decode pipeline unable to update pack / unpack pointers");

    if (rv == EXR_ERR_SUCCESS && decode->decompress_fn)
        rv = decode->decompress_fn (decode);
    if (rv != EXR_ERR_SUCCESS)
        return pctxt->report_error (
            pctxt, rv, "Decode pipeline unable to decompress data");

    if (rv == EXR_ERR_SUCCESS &&
        (part->storage_mode == EXR_STORAGE_DEEP_SCANLINE ||
         part->storage_mode == EXR_STORAGE_DEEP_TILED))
    {
        rv = unpack_sample_table (pctxt, decode);

        if ((decode->decode_flags & EXR_DECODE_SAMPLE_DATA_ONLY)) return rv;
    }

    if (rv != EXR_ERR_SUCCESS)
        return pctxt->report_error (
            pctxt, rv, "Decode pipeline unable to unpack deep sample table");

    if (rv == EXR_ERR_SUCCESS && decode->realloc_nonimage_data_fn)
        rv = decode->realloc_nonimage_data_fn (decode);
    if (rv != EXR_ERR_SUCCESS)
        return pctxt->report_error (
            pctxt,
            rv,
            "Decode pipeline unable to realloc deep sample table info");

    if (rv == EXR_ERR_SUCCESS && decode->unpack_and_convert_fn)
        rv = decode->unpack_and_convert_fn (decode);
    if (rv != EXR_ERR_SUCCESS)
        return pctxt->report_error (
            pctxt, rv, "Decode pipeline unable to unpack and convert data");

    return rv;
}